

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushOverrideID(ImGuiID id)

{
  ImGuiWindow *pIVar1;
  uint *__src;
  int iVar2;
  uint *__dest;
  int iVar3;
  int iVar4;
  
  pIVar1 = GImGui->CurrentWindow;
  if (GImGui->DebugHookIdInfo == id) {
    DebugHookIdInfo(id,0xe,(void *)0x0,(void *)0x0);
  }
  iVar2 = (pIVar1->IDStack).Size;
  if (iVar2 == (pIVar1->IDStack).Capacity) {
    if (iVar2 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar2 / 2 + iVar2;
    }
    iVar4 = iVar2 + 1;
    if (iVar2 + 1 < iVar3) {
      iVar4 = iVar3;
    }
    __dest = (uint *)MemAlloc((long)iVar4 << 2);
    __src = (pIVar1->IDStack).Data;
    if (__src != (uint *)0x0) {
      memcpy(__dest,__src,(long)(pIVar1->IDStack).Size << 2);
      MemFree((pIVar1->IDStack).Data);
    }
    (pIVar1->IDStack).Data = __dest;
    (pIVar1->IDStack).Capacity = iVar4;
    iVar2 = (pIVar1->IDStack).Size;
  }
  else {
    __dest = (pIVar1->IDStack).Data;
  }
  __dest[iVar2] = id;
  (pIVar1->IDStack).Size = (pIVar1->IDStack).Size + 1;
  return;
}

Assistant:

void ImGui::PushOverrideID(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
#ifndef IMGUI_DISABLE_DEBUG_TOOLS
    if (g.DebugHookIdInfo == id)
        DebugHookIdInfo(id, ImGuiDataType_ID, NULL, NULL);
#endif
    window->IDStack.push_back(id);
}